

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# halfedge.cpp
# Opt level: O3

void __thiscall
graphics101::HalfEdgeTriMesh::vertex_vertex_neighbors
          (HalfEdgeTriMesh *this,Index vertex_index,Indices *result)

{
  pointer __args;
  pointer plVar1;
  pointer pHVar2;
  ulong uVar3;
  iterator __position;
  pointer pHVar4;
  pointer pHVar5;
  ulong uVar6;
  ulong uVar7;
  
  plVar1 = (result->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data
           ._M_start;
  if ((result->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
      _M_finish != plVar1) {
    (result->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
    _M_finish = plVar1;
  }
  pHVar2 = (this->m_vertex_halfedges).
           super__Vector_base<graphics101::HalfEdgeTriMesh::HalfEdgeIndex,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)vertex_index <
      (ulong)((long)(this->m_vertex_halfedges).
                    super__Vector_base<graphics101::HalfEdgeTriMesh::HalfEdgeIndex,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdgeIndex>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)pHVar2 >> 3)) {
    uVar3 = pHVar2[vertex_index].value;
    pHVar4 = (this->m_halfedges).
             super__Vector_base<graphics101::HalfEdgeTriMesh::HalfEdge,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdge>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pHVar5 = (this->m_halfedges).
             super__Vector_base<graphics101::HalfEdgeTriMesh::HalfEdge,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdge>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    uVar7 = uVar3;
    while (uVar6 = ((long)pHVar5 - (long)pHVar4 >> 3) * -0x3333333333333333,
          uVar7 <= uVar6 && uVar6 - uVar7 != 0) {
      __args = pHVar4 + uVar7;
      __position._M_current =
           (result->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data
           ._M_finish;
      if (__position._M_current ==
          (result->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<long,std::allocator<long>>::_M_realloc_insert<long_const&>
                  ((vector<long,std::allocator<long>> *)result,__position,&__args->to_vertex);
        pHVar4 = (this->m_halfedges).
                 super__Vector_base<graphics101::HalfEdgeTriMesh::HalfEdge,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdge>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pHVar5 = (this->m_halfedges).
                 super__Vector_base<graphics101::HalfEdgeTriMesh::HalfEdge,_std::allocator<graphics101::HalfEdgeTriMesh::HalfEdge>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        uVar6 = ((long)pHVar5 - (long)pHVar4 >> 3) * -0x3333333333333333;
      }
      else {
        *__position._M_current = __args->to_vertex;
        (result->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
        _M_finish = __position._M_current + 1;
      }
      uVar7 = (__args->opposite_he).value;
      if (uVar6 <= uVar7) break;
      uVar7 = pHVar4[uVar7].next_he.value;
      if (uVar7 == uVar3) {
        return;
      }
    }
  }
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
}

Assistant:

void HalfEdgeTriMesh::vertex_vertex_neighbors( const Index vertex_index, Indices& result ) const
{
    result.clear();

    // Get the outgoing half-edge index for the vertex.
    const HalfEdgeIndex start_hei = outgoing_halfedge_index_for_vertex( vertex_index );
    // Start the iteration at that half-edge index.
    HalfEdgeIndex hei = start_hei;
    while( true )
    {
        // Get the HalfEdge for the half-edge index.
        const HalfEdge& he = halfedge( hei );
        // Store the vertex the half-edge points to.
        result.push_back( he.to_vertex );

        // Increment to the next vertex.
        hei = halfedge( he.opposite_he ).next_he;

        // If we are back where we started, we've seen all vertices.
        if( hei == start_hei ) break;
    }
}